

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

void __thiscall lest::test::test(test *this,text *name_,function<void_(lest::env_&)> *behaviour_)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name_->_M_string_length);
  std::function<void_(lest::env_&)>::function(&this->behaviour,behaviour_);
  return;
}

Assistant:

test( text name_, std::function<void( env & )> behaviour_ )
    : name( name_), behaviour( behaviour_) {}